

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall
pbrt::Image::Image(Image *this,
                  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *p8c,
                  Point2i resolution,
                  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  channels,ColorEncodingHandle *encoding)

{
  int iVar1;
  iterator args_2;
  iterator args_3;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_00;
  size_t sVar2;
  int *piVar3;
  undefined8 in_RDX;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *in_RSI;
  int *in_RDI;
  int vb;
  size_t va;
  ColorEncodingHandle *in_stack_fffffffffffffee8;
  polymorphic_allocator<float> *in_stack_fffffffffffffef0;
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff10;
  polymorphic_allocator<float> *alloc;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this_01;
  polymorphic_allocator<pbrt::Half> *alloc_00;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this_02;
  int line;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_03;
  LogLevel level;
  char (*args_4) [44];
  polymorphic_allocator<float> local_58;
  polymorphic_allocator<pbrt::Half> local_50 [3];
  char local_38 [32];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  Tuple2<pbrt::Point2,_int> local_8;
  
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 1) = in_RDX;
  this_03 = &local_18;
  args_2 = pstd::
           span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(this_03);
  args_3 = pstd::
           span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(this_03);
  level = (LogLevel)((ulong)this_03 >> 0x20);
  args_4 = (char (*) [44])local_38;
  pstd::pmr::
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::polymorphic_allocator
            ((polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffef0);
  InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>::
  InlinedVector<std::__cxx11::string_const*>
            (in_stack_ffffffffffffff10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),in_stack_ffffffffffffff00
             ,in_stack_fffffffffffffef8);
  ColorEncodingHandle::ColorEncodingHandle
            ((ColorEncodingHandle *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  this_02 = (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
            (in_RDI + 0x2e);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::vector
            (this_02,in_RSI);
  line = (int)((ulong)this_02 >> 0x20);
  this_01 = (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)(in_RDI + 0x36);
  alloc_00 = local_50;
  pstd::pmr::polymorphic_allocator<pbrt::Half>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::Half> *)in_stack_fffffffffffffef0);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::vector(this_01,alloc_00);
  this_00 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x3e);
  alloc = &local_58;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator(in_stack_fffffffffffffef0);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector(this_00,alloc);
  sVar2 = pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                     (in_RDI + 0x2e));
  iVar1 = NChannels((Image *)0x874a89);
  piVar3 = Tuple2<pbrt::Point2,_int>::operator[](&local_8,0);
  iVar1 = iVar1 * *piVar3;
  piVar3 = Tuple2<pbrt::Point2,_int>::operator[](&local_8,1);
  if (sVar2 != (long)(iVar1 * *piVar3)) {
    LogFatal<char_const(&)[10],char_const(&)[44],char_const(&)[10],unsigned_long&,char_const(&)[44],int&>
              (level,(char *)in_RSI,line,(char *)alloc_00,(char (*) [10])this_01,
               (char (*) [44])alloc,(char (*) [10])args_2,(unsigned_long *)args_3,args_4,in_RDI);
  }
  return;
}

Assistant:

Image::Image(pstd::vector<uint8_t> p8c, Point2i resolution,
             pstd::span<const std::string> channels, ColorEncodingHandle encoding)
    : format(PixelFormat::U256),
      resolution(resolution),
      channelNames(channels.begin(), channels.end()),
      encoding(encoding),
      p8(std::move(p8c)) {
    CHECK_EQ(p8.size(), NChannels() * resolution[0] * resolution[1]);
}